

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

StringList * __thiscall
Rml::DataViewCommon::GetVariableNameList_abi_cxx11_
          (StringList *__return_storage_ptr__,DataViewCommon *this)

{
  code *pcVar1;
  bool bVar2;
  pointer this_00;
  DataViewCommon *this_local;
  
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->expression);
  if ((!bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x44), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_00 = ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::
            operator->(&this->expression);
  DataExpression::GetVariableNameList_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

StringList DataViewCommon::GetVariableNameList() const
{
	RMLUI_ASSERT(expression);
	return expression->GetVariableNameList();
}